

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool (anonymous_namespace)::miniz::tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 *pmVar1;
  mz_uint16 *pmVar2;
  byte bVar3;
  ushort uVar4;
  mz_uint8 *pmVar5;
  ushort uVar6;
  byte *pbVar7;
  mz_uint8 (*pamVar8) [288];
  long lVar9;
  mz_uint16 (*pamVar10) [288];
  uint uVar11;
  uint uVar12;
  long lVar13;
  mz_uint16 *pmVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  mz_uint8 *pmVar21;
  uint uVar22;
  byte bVar23;
  mz_uint mVar24;
  int iVar25;
  byte bVar26;
  byte *pbVar27;
  bool bVar28;
  mz_uint8 code_sizes_to_pack [320];
  byte abStack_2b8 [320];
  byte local_178 [328];
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar25 = 0x11f;
    lVar13 = 0x9067;
    do {
      if (lVar13 - 0x8f49U < 0x102) {
        iVar25 = 0x101;
        break;
      }
      iVar25 = iVar25 + -1;
      lVar9 = lVar13 + -0x14;
      lVar13 = lVar13 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar9) == '\0');
    iVar16 = 0x1f;
    lVar13 = 36999;
    do {
      if (lVar13 - 0x9069U < 2) {
        iVar16 = 1;
        break;
      }
      iVar16 = iVar16 + -1;
      lVar9 = lVar13 + -0x14;
      lVar13 = lVar13 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar9) == '\0');
    memcpy(local_178,d->m_huff_code_sizes,(long)iVar25);
    memcpy(local_178 + iVar25,d->m_huff_code_sizes + 1,(long)iVar16);
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xe) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x16) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x24) = 0;
    if (iVar16 + iVar25 == 0) {
      uVar22 = 0;
    }
    else {
      pamVar10 = d->m_huff_count + 2;
      pmVar1 = d->m_huff_count[2] + 0x12;
      pmVar2 = d->m_huff_count[2] + 0x11;
      uVar19 = 0;
      uVar22 = 0;
      uVar18 = 0;
      uVar11 = 0;
      uVar20 = 0xff;
      do {
        bVar23 = local_178[uVar19];
        uVar17 = (ulong)bVar23;
        bVar26 = (byte)uVar20;
        if (uVar17 == 0) {
          if (uVar11 != 0) {
            if (uVar11 < 3) {
              (*pamVar10)[uVar20] = (*pamVar10)[uVar20] + (short)uVar11;
              uVar12 = uVar22;
              do {
                uVar22 = uVar12 + 1;
                abStack_2b8[uVar12] = bVar26;
                uVar11 = uVar11 - 1;
                uVar12 = uVar22;
              } while (uVar11 != 0);
            }
            else {
              pmVar14 = d->m_huff_count[2] + 0x10;
              *pmVar14 = *pmVar14 + 1;
              uVar12 = uVar22 + 1;
              abStack_2b8[uVar22] = 0x10;
              uVar22 = uVar22 + 2;
              abStack_2b8[uVar12] = (char)uVar11 - 3;
            }
          }
          uVar18 = uVar18 + 1;
          if (uVar18 == 0x8a) {
            *pmVar1 = *pmVar1 + 1;
            abStack_2b8[uVar22] = 0x12;
            abStack_2b8[uVar22 + 1] = 0x7f;
LAB_0019c2e0:
            uVar22 = uVar22 + 2;
            uVar11 = 0;
            goto LAB_0019c2e3;
          }
          uVar11 = 0;
        }
        else {
          if (uVar18 != 0) {
            if (uVar18 < 3) {
              (*pamVar10)[0] = (*pamVar10)[0] + (short)uVar18;
              uVar12 = uVar22;
              do {
                uVar22 = uVar12 + 1;
                abStack_2b8[uVar12] = 0;
                uVar18 = uVar18 - 1;
                uVar12 = uVar22;
              } while (uVar18 != 0);
            }
            else {
              bVar28 = uVar18 < 0xb;
              pmVar14 = pmVar1;
              if (bVar28) {
                pmVar14 = pmVar2;
              }
              *pmVar14 = *pmVar14 + 1;
              abStack_2b8[uVar22] = 0x12 - bVar28;
              abStack_2b8[uVar22 + 1] = (bVar28 * '\b' + (char)uVar18) - 0xb;
              uVar22 = uVar22 + 2;
            }
          }
          if (bVar23 == bVar26) {
            uVar11 = uVar11 + 1;
            if (uVar11 == 6) {
              pmVar14 = d->m_huff_count[2] + 0x10;
              *pmVar14 = *pmVar14 + 1;
              abStack_2b8[uVar22] = 0x10;
              abStack_2b8[uVar22 + 1] = 3;
              goto LAB_0019c2e0;
            }
LAB_0019c2e3:
            uVar18 = 0;
          }
          else {
            if (uVar11 != 0) {
              if (uVar11 < 3) {
                (*pamVar10)[uVar20] = (*pamVar10)[uVar20] + (short)uVar11;
                uVar18 = uVar22;
                do {
                  uVar22 = uVar18 + 1;
                  abStack_2b8[uVar18] = bVar26;
                  uVar11 = uVar11 - 1;
                  uVar18 = uVar22;
                } while (uVar11 != 0);
              }
              else {
                pmVar14 = d->m_huff_count[2] + 0x10;
                *pmVar14 = *pmVar14 + 1;
                uVar18 = uVar22 + 1;
                abStack_2b8[uVar22] = 0x10;
                uVar22 = uVar22 + 2;
                abStack_2b8[uVar18] = (char)uVar11 - 3;
              }
            }
            uVar20 = (ulong)uVar22;
            (*pamVar10)[uVar17] = (*pamVar10)[uVar17] + 1;
            uVar22 = uVar22 + 1;
            abStack_2b8[uVar20] = bVar23;
            uVar11 = 0;
            uVar18 = 0;
          }
        }
        uVar19 = uVar19 + 1;
        uVar20 = uVar17;
      } while (uVar19 != (uint)(iVar16 + iVar25));
      if (uVar11 == 0) {
        if (uVar18 != 0) {
          if (uVar18 < 3) {
            (*pamVar10)[0] = (*pamVar10)[0] + (short)uVar18;
            uVar11 = uVar22;
            do {
              uVar22 = uVar11 + 1;
              abStack_2b8[uVar11] = 0;
              uVar18 = uVar18 - 1;
              uVar11 = uVar22;
            } while (uVar18 != 0);
          }
          else {
            if (uVar18 < 0xb) {
              *pmVar2 = *pmVar2 + 1;
              abStack_2b8[uVar22] = 0x11;
              bVar23 = (char)uVar18 - 3;
            }
            else {
              *pmVar1 = *pmVar1 + 1;
              abStack_2b8[uVar22] = 0x12;
              bVar23 = (char)uVar18 - 0xb;
            }
            abStack_2b8[uVar22 + 1] = bVar23;
            uVar22 = uVar22 + 2;
          }
        }
      }
      else if (uVar11 < 3) {
        (*pamVar10)[uVar17] = (*pamVar10)[uVar17] + (short)uVar11;
        uVar18 = uVar22;
        do {
          uVar22 = uVar18 + 1;
          abStack_2b8[uVar18] = bVar23;
          uVar11 = uVar11 - 1;
          uVar18 = uVar22;
        } while (uVar11 != 0);
      }
      else {
        pmVar1 = d->m_huff_count[2] + 0x10;
        *pmVar1 = *pmVar1 + 1;
        uVar18 = uVar22 + 1;
        abStack_2b8[uVar22] = 0x10;
        uVar22 = uVar22 + 2;
        abStack_2b8[uVar18] = (char)uVar11 - 3;
      }
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    mVar24 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = mVar24;
    uVar11 = d->m_bits_in + 2;
    d->m_bits_in = uVar11;
    while (7 < uVar11) {
      pmVar21 = d->m_pOutput_buf;
      if (pmVar21 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar21 + 1;
        *pmVar21 = (mz_uint8)mVar24;
        uVar11 = d->m_bits_in;
        mVar24 = d->m_bit_buffer;
      }
      mVar24 = mVar24 >> 8;
      d->m_bit_buffer = mVar24;
      uVar11 = uVar11 - 8;
      d->m_bits_in = uVar11;
    }
    if (0x1f < iVar25 - 0x101U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0xc3f,
                    "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                   );
    }
    mVar24 = iVar25 - 0x101U << ((byte)uVar11 & 0x1f) | mVar24;
    d->m_bit_buffer = mVar24;
    uVar12 = uVar11 + 5;
    d->m_bits_in = uVar12;
    if (2 < uVar11) {
      do {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)mVar24;
          uVar12 = d->m_bits_in;
          mVar24 = d->m_bit_buffer;
        }
        mVar24 = mVar24 >> 8;
        d->m_bit_buffer = mVar24;
        uVar12 = uVar12 - 8;
        d->m_bits_in = uVar12;
      } while (7 < uVar12);
    }
    if (0x1f < iVar16 - 1U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0xc40,
                    "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                   );
    }
    uVar18 = iVar16 - 1U << ((byte)uVar12 & 0x1f) | mVar24;
    d->m_bit_buffer = uVar18;
    uVar15 = uVar12 + 5;
    d->m_bits_in = uVar15;
    if (2 < uVar12) {
      do {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)uVar18;
          uVar15 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
        uVar15 = uVar15 - 8;
        d->m_bits_in = uVar15;
      } while (7 < uVar15);
    }
    uVar11 = 0x12;
    do {
      if (d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar11]] != '\0') goto LAB_0019c513;
      bVar28 = uVar11 != 0;
      uVar11 = uVar11 - 1;
    } while (bVar28);
    uVar11 = 0xffffffff;
LAB_0019c513:
    uVar12 = 3;
    if (3 < (int)uVar11) {
      uVar12 = uVar11;
    }
    if (0xf < uVar12 - 3) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0xc47,
                    "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                   );
    }
    uVar18 = uVar12 - 3 << ((byte)uVar15 & 0x1f) | uVar18;
    d->m_bit_buffer = uVar18;
    uVar11 = uVar15 + 4;
    d->m_bits_in = uVar11;
    if (3 < uVar15) {
      do {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)uVar18;
          uVar11 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
        uVar11 = uVar11 - 8;
        d->m_bits_in = uVar11;
      } while (7 < uVar11);
    }
    uVar20 = 0;
    do {
      uVar15 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar20]];
      if (7 < uVar15) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0xc4a,
                      "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                     );
      }
      bVar23 = (byte)uVar11 & 0x1f;
      uVar18 = uVar18 | uVar15 << bVar23;
      d->m_bit_buffer = uVar18;
      uVar11 = uVar11 + 3;
      d->m_bits_in = uVar11;
      while (7 < uVar11) {
        pmVar21 = d->m_pOutput_buf;
        if (pmVar21 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar21 + 1;
          *pmVar21 = (mz_uint8)uVar18;
          uVar11 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
        uVar11 = uVar11 - 8;
        d->m_bits_in = uVar11;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar12 + 1);
    if (uVar22 != 0) {
      uVar12 = 0 << bVar23;
      do {
        bVar23 = abStack_2b8[uVar12];
        uVar20 = (ulong)bVar23;
        if (0x12 < uVar20) {
          __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xc4f,
                        "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[2][uVar20];
        bVar26 = d->m_huff_code_sizes[2][uVar20];
        if (uVar4 >> (bVar26 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xc50,
                        "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                       );
        }
        uVar18 = (uint)uVar4 << ((byte)uVar11 & 0x1f) | uVar18;
        d->m_bit_buffer = uVar18;
        uVar11 = bVar26 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar21 = d->m_pOutput_buf;
          if (pmVar21 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar21 + 1;
            *pmVar21 = (mz_uint8)uVar18;
            uVar11 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
          uVar11 = uVar11 - 8;
          d->m_bits_in = uVar11;
        }
        uVar15 = uVar12 + 1;
        if (0xf < bVar23) {
          bVar23 = "\x02\x03\a"[bVar23 - 0x10];
          if (abStack_2b8[(ulong)uVar12 + 1] >> (bVar23 & 0x1f) != 0) {
            __assert_fail("bits <= ((1U << len) - 1U)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0xc53,
                          "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                         );
          }
          uVar18 = (uint)abStack_2b8[(ulong)uVar12 + 1] << ((byte)uVar11 & 0x1f) | uVar18;
          d->m_bit_buffer = uVar18;
          uVar11 = (int)(char)bVar23 + uVar11;
          d->m_bits_in = uVar11;
          while (uVar15 = uVar12 + 2, 7 < uVar11) {
            pmVar21 = d->m_pOutput_buf;
            if (pmVar21 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar21 + 1;
              *pmVar21 = (mz_uint8)uVar18;
              uVar11 = d->m_bits_in;
              uVar18 = d->m_bit_buffer;
            }
            uVar18 = uVar18 >> 8;
            d->m_bit_buffer = uVar18;
            uVar11 = uVar11 - 8;
            d->m_bits_in = uVar11;
          }
        }
        uVar12 = uVar15;
      } while (uVar12 < uVar22);
    }
  }
  else {
    memset(d->m_huff_code_sizes,8,0x90);
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x90) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x91) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x92) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x93) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x94) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x95) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x96) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x97) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x98) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x99) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9a) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9b) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9c) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9d) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9e) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9f) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xab) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xac) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xad) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xae) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xba) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 199) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 200) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xca) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xce) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xda) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xde) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xea) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xeb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xec) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xed) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xee) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xef) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xff) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x100) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x101) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x102) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x103) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x104) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x105) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x106) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x107) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x108) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x109) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10a) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10b) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10c) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10d) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10e) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10f) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x110) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x111) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x112) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x113) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x114) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x115) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x116) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x117) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x118) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x119) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11a) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11b) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11c) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11d) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11e) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11f) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar8 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar8 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xf) = '\x05';
    pamVar8 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x17) = '\x05';
    pamVar8 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1f) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    uVar18 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = uVar18;
    uVar11 = d->m_bits_in + 2;
    d->m_bits_in = uVar11;
    while (7 < uVar11) {
      pmVar21 = d->m_pOutput_buf;
      if (pmVar21 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar21 + 1;
        *pmVar21 = (mz_uint8)uVar18;
        uVar11 = d->m_bits_in;
        uVar18 = d->m_bit_buffer;
      }
      uVar18 = uVar18 >> 8;
      d->m_bit_buffer = uVar18;
      uVar11 = uVar11 - 8;
      d->m_bits_in = uVar11;
    }
  }
  pmVar21 = d->m_lz_code_buf;
  if (pmVar21 < d->m_pLZ_code_buf) {
    uVar22 = 1;
    do {
      if (uVar22 == 1) {
        bVar23 = *pmVar21;
        pmVar21 = pmVar21 + 1;
        uVar22 = bVar23 | 0x100;
      }
      if ((uVar22 & 1) == 0) {
        bVar23 = d->m_huff_code_sizes[0][*pmVar21];
        if (bVar23 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcf2,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[0][*pmVar21];
        if (uVar4 >> (bVar23 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcf3,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        pmVar21 = pmVar21 + 1;
        uVar18 = uVar18 | (uint)uVar4 << ((byte)uVar11 & 0x1f);
        d->m_bit_buffer = uVar18;
        uVar11 = bVar23 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)uVar18;
            uVar11 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
          uVar11 = uVar11 - 8;
          d->m_bits_in = uVar11;
        }
      }
      else {
        bVar23 = *pmVar21;
        bVar26 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar23]];
        if (bVar26 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xce0,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[0][s_tdefl_len_sym[bVar23]];
        if (uVar4 >> (bVar26 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xce2,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        bVar3 = pmVar21[2];
        uVar6 = *(ushort *)(pmVar21 + 1);
        uVar18 = uVar18 | (uint)uVar4 << ((byte)uVar11 & 0x1f);
        d->m_bit_buffer = uVar18;
        uVar11 = bVar26 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)uVar18;
            uVar11 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
          uVar11 = uVar11 - 8;
          d->m_bits_in = uVar11;
        }
        bVar26 = ""[bVar23];
        if ((mz_bitmasks[bVar26] & (uint)bVar23) >> (bVar26 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xce4,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        mVar24 = (mz_bitmasks[bVar26] & (uint)bVar23) << ((byte)uVar11 & 0x1f) | uVar18;
        d->m_bit_buffer = mVar24;
        uVar11 = bVar26 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)mVar24;
            uVar11 = d->m_bits_in;
            mVar24 = d->m_bit_buffer;
          }
          mVar24 = mVar24 >> 8;
          d->m_bit_buffer = mVar24;
          uVar11 = uVar11 - 8;
          d->m_bits_in = uVar11;
        }
        uVar18 = (uint)uVar6;
        pbVar27 = "" + bVar3;
        pbVar7 = "" + bVar3;
        if (bVar3 < 2) {
          pbVar27 = "" + uVar18;
          pbVar7 = "" + uVar18;
        }
        bVar23 = d->m_huff_code_sizes[1][*pbVar27];
        if (bVar23 == 0) {
          __assert_fail("d->m_huff_code_sizes[1][sym]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xced,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[1][*pbVar27];
        if (uVar4 >> (bVar23 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcee,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        bVar26 = *pbVar7;
        mVar24 = (uint)uVar4 << ((byte)uVar11 & 0x1f) | mVar24;
        d->m_bit_buffer = mVar24;
        uVar11 = bVar23 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)mVar24;
            uVar11 = d->m_bits_in;
            mVar24 = d->m_bit_buffer;
          }
          mVar24 = mVar24 >> 8;
          d->m_bit_buffer = mVar24;
          uVar11 = uVar11 - 8;
          d->m_bits_in = uVar11;
        }
        if ((uVar18 & mz_bitmasks[bVar26]) >> (bVar26 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcef,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        pmVar21 = pmVar21 + 3;
        uVar18 = (uVar18 & mz_bitmasks[bVar26]) << ((byte)uVar11 & 0x1f) | mVar24;
        d->m_bit_buffer = uVar18;
        uVar11 = bVar26 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)uVar18;
            uVar11 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
          uVar11 = uVar11 - 8;
          d->m_bits_in = uVar11;
        }
      }
      uVar22 = uVar22 >> 1;
    } while (pmVar21 < d->m_pLZ_code_buf);
  }
  uVar4 = d->m_huff_codes[0][0x100];
  bVar23 = d->m_huff_code_sizes[0][0x100];
  if (uVar4 >> (bVar23 & 0x1f) != 0) {
    __assert_fail("bits <= ((1U << len) - 1U)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0xcf7,
                  "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                 );
  }
  uVar18 = uVar18 | (uint)uVar4 << ((byte)uVar11 & 0x1f);
  d->m_bit_buffer = uVar18;
  uVar11 = bVar23 + uVar11;
  d->m_bits_in = uVar11;
  while (7 < uVar11) {
    pmVar21 = d->m_pOutput_buf;
    if (pmVar21 < d->m_pOutput_buf_end) {
      d->m_pOutput_buf = pmVar21 + 1;
      *pmVar21 = (mz_uint8)uVar18;
      uVar11 = d->m_bits_in;
      uVar18 = d->m_bit_buffer;
    }
    uVar18 = uVar18 >> 8;
    d->m_bit_buffer = uVar18;
    uVar11 = uVar11 - 8;
    d->m_bits_in = uVar11;
  }
  return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}